

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
helics::FederateState::getMessageDestinations(FederateState *this,InterfaceHandle handle)

{
  EndpointInfo *this_00;
  InterfaceHandle in_EDX;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RSI;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RDI;
  EndpointInfo *eptInfo;
  lock_guard<helics::FederateState> fedlock;
  mutex_type *in_stack_ffffffffffffff98;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *__s;
  InterfaceInfo *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff0;
  
  __s = in_RDI;
  std::lock_guard<helics::FederateState>::lock_guard
            ((lock_guard<helics::FederateState> *)in_RDI,in_stack_ffffffffffffff98);
  this_00 = InterfaceInfo::getEndpoint(in_stack_ffffffffffffffc8,in_EDX);
  if (this_00 == (EndpointInfo *)0x0) {
    memset(__s,0,0x18);
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)0x57c365);
  }
  else {
    EndpointInfo::getTargets(this_00);
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)CONCAT44(in_EDX.hid,in_stack_fffffffffffffff0),in_RSI);
  }
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x57c377)
  ;
  return in_RDI;
}

Assistant:

std::vector<std::pair<GlobalHandle, std::string_view>>
    FederateState::getMessageDestinations(InterfaceHandle handle)
{
    const std::lock_guard<FederateState> fedlock(*this);
    const auto* eptInfo = interfaceInformation.getEndpoint(handle);
    if (eptInfo != nullptr) {
        return eptInfo->getTargets();
    }
    return {};
}